

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_fill(nk_draw_list *list,nk_color color)

{
  nk_vec2 *points;
  
  if (list != (nk_draw_list *)0x0) {
    points = (nk_vec2 *)nk_buffer_memory(list->buffer);
    nk_draw_list_fill_poly_convex(list,points,list->path_count,color,(list->config).shape_AA);
    nk_draw_list_path_clear(list);
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x273a,"void nk_draw_list_path_fill(struct nk_draw_list *, struct nk_color)");
}

Assistant:

NK_API void
nk_draw_list_path_fill(struct nk_draw_list *list, struct nk_color color)
{
    struct nk_vec2 *points;
    NK_ASSERT(list);
    if (!list) return;
    points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
    nk_draw_list_fill_poly_convex(list, points, list->path_count, color, list->config.shape_AA);
    nk_draw_list_path_clear(list);
}